

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_custom_inplace(ggml_context *ctx,ggml_tensor *a,ggml_tensor **args,int n_args,
                   ggml_custom_op_t fun,int n_tasks,void *userdata)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  ulong uVar3;
  int line;
  char *file;
  
  if (n_args < 9) {
    pgVar1 = ggml_view_tensor(ctx,a);
    if (pgVar1 != (ggml_tensor *)0x0) {
      *(ggml_custom_op_t *)pgVar1->op_params = fun;
      pgVar1->op_params[2] = n_tasks;
      *(void **)(pgVar1->op_params + 4) = userdata;
      pgVar1->op = GGML_OP_CUSTOM;
      pgVar1->src[0] = a;
      if (0 < n_args) {
        uVar3 = 0;
        do {
          pgVar1->src[uVar3 + 1] = args[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)n_args != uVar3);
      }
      return pgVar1;
    }
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
    pcVar2 = "tensor != NULL";
    line = 0x70;
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar2 = "n_args < GGML_MAX_SRC - 1";
    line = 0x13d2;
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_custom_inplace(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor ** args,
        int                   n_args,
        ggml_custom_op_t      fun,
        int                   n_tasks,
        void                * userdata) {

    GGML_ASSERT(n_args < GGML_MAX_SRC - 1);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    struct ggml_custom_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op = GGML_OP_CUSTOM;
    result->src[0] = a;
    for (int i = 0; i < n_args; i++) {
        result->src[i + 1] = args[i];
    }

    return result;
}